

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O3

void state_align_search_fill_iter(ps_seg_t *seg)

{
  int iVar1;
  ps_alignment_entry_t *ppVar2;
  char *pcVar3;
  
  ppVar2 = ps_alignment_iter_get((ps_alignment_iter_t *)seg[1].vt);
  iVar1 = ppVar2->start;
  seg->sf = iVar1;
  seg->ef = iVar1 + ppVar2->duration + -1;
  seg->ascr = ppVar2->score;
  seg->lscr = 0;
  if ((long)(ppVar2->id).wid < 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = seg->search->dict->word[(ppVar2->id).wid].word;
  }
  seg->text = pcVar3;
  seg->wid = (ppVar2->id).wid;
  return;
}

Assistant:

static void
state_align_search_fill_iter(ps_seg_t *seg)
{
    state_align_seg_t *itor = (state_align_seg_t *)seg;
    ps_alignment_entry_t *entry = ps_alignment_iter_get(itor->itor);

    seg->sf = entry->start;
    seg->ef = entry->start + entry->duration - 1;
    seg->ascr = entry->score;
    seg->lscr = 0;
    seg->text = dict_wordstr(ps_search_dict(seg->search), entry->id.wid);
    seg->wid = entry->id.wid;
}